

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlcrc.c
# Opt level: O3

bool_t EBML_CRCMatches(ebml_crc *CRC,void *Buf,size_t Size)

{
  uint uVar1;
  size_t sVar2;
  
  if ((CRC->Base).bValueIsSet == '\0') {
    __assert_fail("CRC->Base.bValueIsSet",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlcrc.c"
                  ,0xd6,"bool_t EBML_CRCMatches(ebml_crc *, const void *, size_t)");
  }
  uVar1 = 0xffffffff;
  if (3 < Size) {
    do {
      uVar1 = (uVar1 ^ *Buf) >> 8 ^ m_tab[(uVar1 ^ *Buf) & 0xff];
      uVar1 = uVar1 >> 8 ^ m_tab[uVar1 & 0xff];
      uVar1 = uVar1 >> 8 ^ m_tab[uVar1 & 0xff];
      uVar1 = uVar1 >> 8 ^ m_tab[uVar1 & 0xff];
      Size = Size - 4;
      Buf = (void *)((long)Buf + 4);
    } while (3 < Size);
  }
  if (Size != 0) {
    sVar2 = 0;
    do {
      uVar1 = uVar1 >> 8 ^ m_tab[(uint)*(byte *)((long)Buf + sVar2) ^ uVar1 & 0xff];
      sVar2 = sVar2 + 1;
    } while (Size != sVar2);
  }
  return (ulong)((uVar1 ^ CRC->CRC) == 0xffffffff);
}

Assistant:

META_END(EBML_ELEMENT_CLASS)

bool_t EBML_CRCMatches(ebml_crc *CRC, const void *Buf, size_t Size)
{
    uint32_t testCRC = CRC32_NEGL;

    assert(CRC->Base.bValueIsSet);

/* TODO: needed for non aligned memory ?
	for(; !aligned(Buf) && Size > 0; Size--)
		testCRC = m_tab[CRC32_INDEX(testCRC) ^ *Buf++] ^ CRC32_SHIFTED(testCRC);
*/
	const uint32_t *Buf32 = Buf;
	while (Size >= 4)
	{
		testCRC ^= *Buf32;
		testCRC = m_tab[CRC32_INDEX(testCRC)] ^ CRC32_SHIFTED(testCRC);
		testCRC = m_tab[CRC32_INDEX(testCRC)] ^ CRC32_SHIFTED(testCRC);
		testCRC = m_tab[CRC32_INDEX(testCRC)] ^ CRC32_SHIFTED(testCRC);
		testCRC = m_tab[CRC32_INDEX(testCRC)] ^ CRC32_SHIFTED(testCRC);
		Size -= 4;
		Buf32++;
	}

	const uint8_t *Buf8 = (const uint8_t *)Buf32;
	while (Size--)
		testCRC = m_tab[CRC32_INDEX(testCRC) ^ *Buf8++] ^ CRC32_SHIFTED(testCRC);

	testCRC ^= CRC32_NEGL;

    return (CRC->CRC == testCRC);
}